

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O0

int encodeSignatureBits(uint8_t *sig)

{
  int length;
  int length_00;
  uint8_t *puVar1;
  int sLength;
  int rLength;
  uint8_t *s;
  uint8_t *r;
  uint8_t *begin;
  uint8_t *sig_local;
  
  length = determineAsn1IntLength(sig + 8);
  length_00 = determineAsn1IntLength(sig + 0x28);
  *sig = '0';
  sig[1] = (char)length + '\x04' + (char)length_00;
  puVar1 = writeAsn1Int(sig + 2,sig + 8,length);
  puVar1 = writeAsn1Int(puVar1,sig + 0x28,length_00);
  return (int)puVar1 - (int)sig;
}

Assistant:

static int
encodeSignatureBits(uint8_t* sig)
{
  const uint8_t* begin = sig;
  const uint8_t* r = sig + 8;
  const uint8_t* s = r + 32;
  int rLength = determineAsn1IntLength(r);
  int sLength = determineAsn1IntLength(s);

  *(sig++) = ASN1_SEQUENCE;
  *(sig++) = 2 + rLength + 2 + sLength;
  sig = writeAsn1Int(sig, r, rLength);
  sig = writeAsn1Int(sig, s, sLength);

  return sig - begin;
}